

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O3

string * __thiscall
anon_unknown.dwarf_617c63::TransformActionAppend::operator()
          (string *__return_storage_ptr__,TransformActionAppend *this,string *s)

{
  TransformSelector *pTVar1;
  pointer pcVar2;
  int iVar3;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_48;
  size_type local_30;
  pointer local_28;
  undefined8 local_20;
  
  pTVar1 = (this->super_TransformAction).Selector;
  iVar3 = (*(pTVar1->super_TransformSelector)._vptr_TransformSelector[4])(pTVar1,s);
  if ((char)iVar3 == '\0') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (s->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + s->_M_string_length);
  }
  else {
    local_48.first._M_str = (s->_M_dataplus)._M_p;
    local_48.first._M_len = s->_M_string_length;
    local_48.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_28 = (this->Append)._M_dataplus._M_p;
    local_30 = (this->Append)._M_string_length;
    local_20 = 0;
    views._M_len = 2;
    views._M_array = &local_48;
    cmCatViews(__return_storage_ptr__,views);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(const std::string& s) override
  {
    if (this->Selector->InSelection(s)) {
      return cmStrCat(s, this->Append);
    }

    return s;
  }